

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctkern__cl_parse(fctkern_t *nk)

{
  fct_clp_t *clp_00;
  fct_nlist_t *list;
  undefined8 uVar1;
  undefined8 uVar2;
  char **ppcVar3;
  size_t sVar4;
  FILE *__stream;
  int iVar5;
  int iVar6;
  int iVar7;
  char *__s;
  char *option;
  char *pcVar8;
  fctcl_t *clo;
  char *pcVar9;
  size_t sVar10;
  undefined8 *puVar11;
  fct_logger_i *itm;
  long lVar12;
  char *buffer_len;
  long *plVar13;
  fct_clp_t *clp;
  size_t sVar14;
  char *err;
  undefined1 local_48 [16];
  
  iVar7 = 0;
  if ((nk != (fctkern_t *)0x0) &&
     ((nk->cl_user_opts == (fctcl_init_t *)0x0 ||
      (iVar5 = fct_clp__add_options(&nk->cl_parser,nk->cl_user_opts), iVar5 != 0)))) {
    clp_00 = &nk->cl_parser;
    iVar5 = fct_clp__add_options(clp_00,FCT_CLP_OPTIONS);
    iVar7 = 0;
    if (iVar5 != 0) {
      iVar7 = nk->cl_argc;
      ppcVar3 = nk->cl_argv;
      pcVar9 = (nk->cl_parser).error_msg;
      (nk->cl_parser).error_msg[0] = '\0';
      (nk->cl_parser).is_error = 0;
      list = &(nk->cl_parser).param_list;
      for (iVar5 = 1; iVar5 < iVar7; iVar5 = iVar5 + 1) {
        __s = fctstr_clone(ppcVar3[iVar5]);
        option = strtok(__s,"=");
        pcVar8 = strtok((char *)0x0,"=");
        sVar4 = (nk->cl_parser).clo_list.used_itm_num;
        sVar14 = 0;
        do {
          if (sVar4 == sVar14) {
            if ((nk->cl_parser).is_error != 0) goto LAB_00103cd6;
            fct_nlist__append(list,__s);
            __s = (char *)0x0;
            goto LAB_001039f8;
          }
          clo = (fctcl_t *)fct_nlist__at(&clp_00->clo_list,sVar14);
          buffer_len = option;
          iVar6 = fctcl__is_option(clo,option);
          sVar14 = sVar14 + 1;
        } while (iVar6 == 0);
        if (clo->action == FCTCL_STORE_TRUE) {
          pcVar8 = fctstr_clone("1");
LAB_001039e1:
          clo->value = pcVar8;
        }
        else if (clo->action == FCTCL_STORE_VALUE) {
          if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
            iVar5 = iVar5 + 1;
            if (iVar7 <= iVar5) {
              fct_snprintf(pcVar9,(size_t)buffer_len,"missing argument for %s",option);
              (nk->cl_parser).is_error = 1;
              goto LAB_00103cd6;
            }
            pcVar8 = ppcVar3[iVar5];
          }
          pcVar8 = fctstr_clone(pcVar8);
          goto LAB_001039e1;
        }
        if ((nk->cl_parser).is_error != 0) goto LAB_00103cd6;
LAB_001039f8:
        free(__s);
      }
      if ((nk->cl_parser).is_error == 0) {
        sVar4 = (nk->cl_parser).param_list.used_itm_num;
        for (sVar14 = 0; sVar4 != sVar14; sVar14 = sVar14 + 1) {
          pcVar9 = (char *)fct_nlist__at(list,sVar14);
          if (pcVar9 == (char *)0x0) {
            __assert_fail("prefix_filter != ((void*)0) && \"invalid arg\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                          ,0x7de,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
          }
          sVar10 = strlen(pcVar9);
          if (sVar10 == 0) {
            __assert_fail("strlen(prefix_filter) > 0 && \"invalid arg\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                          ,0x7df,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
          }
          pcVar8 = (char *)malloc(sVar10 + 1);
          fctstr_safe_cpy(pcVar8,pcVar9,sVar10 + 1);
          fct_nlist__append(&nk->prefix_list,pcVar8);
        }
        iVar7 = fctkern__cl_is(nk,"--version");
        if (iVar7 == 0) {
          iVar7 = fctkern__cl_is(nk,"--help");
          __stream = _stdout;
          if (iVar7 == 0) {
            pcVar9 = fct_clp__optval2(clp_00,"--logger","standard");
            if (pcVar9 == (char *)0x0) {
              __assert_fail("sel_logger != ((void*)0) && \"should never be NULL\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                            ,0x82f,"int fctkern__cl_parse_config_logger(fctkern_t *)");
            }
            if (nk->lt_usr == (fct_logger_types_t *)0x0) {
              itm = (fct_logger_i *)0x0;
            }
            else {
              itm = fckern_sel_log(nk->lt_usr,pcVar9);
            }
            if (itm == (fct_logger_i *)0x0 && nk->lt_sys != (fct_logger_types_t *)0x0) {
              itm = fckern_sel_log(nk->lt_sys,pcVar9);
            }
            if (itm != (fct_logger_i *)0x0) {
              fct_nlist__append(&nk->logger_list,itm);
              nk->cl_is_parsed = 1;
              return 1;
            }
            fprintf(_stderr,"error: unknown logger selected - \'%s\'",pcVar9);
          }
          else {
            fwrite("test.exe [options] prefix_filter ...\n\n",0x26,1,_stdout);
            sVar4 = (nk->cl_parser).clo_list.used_itm_num;
            for (sVar14 = 0; sVar14 != sVar4; sVar14 = sVar14 + 1) {
              puVar11 = (undefined8 *)fct_nlist__at(&clp_00->clo_list,sVar14);
              if (puVar11[1] == 0) {
                fprintf(__stream,"%s\n",*puVar11);
              }
              else {
                fprintf(__stream,"%s, %s\n");
              }
              iVar7 = fctstr_ieq((char *)*puVar11,"--logger");
              if (iVar7 == 0) {
                pcVar9 = (char *)puVar11[3];
                pcVar8 = "  %s\n";
              }
              else {
                uVar1 = nk->lt_usr;
                uVar2 = nk->lt_sys;
                local_48._8_4_ = (int)uVar1;
                local_48._0_8_ = uVar2;
                local_48._12_4_ = (int)((ulong)uVar1 >> 0x20);
                fputs("  Sets the logger. The types of loggers currently available are,\n",__stream)
                ;
                for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
                  for (plVar13 = *(long **)(local_48 + lVar12 * 8);
                      (plVar13 != (long *)0x0 && (*plVar13 != 0)); plVar13 = plVar13 + 3) {
                    fprintf(__stream,"   =%s : %s\n",*plVar13,plVar13[2]);
                  }
                }
                pcVar8 = "  default is \'%s\'.\n";
                pcVar9 = "standard";
              }
              fprintf(__stream,pcVar8,pcVar9);
            }
            fputs("\n",__stream);
          }
        }
        else {
          printf("Built using FCTX version %s.\n","1.6.1");
        }
        iVar7 = -1;
      }
      else {
LAB_00103cd6:
        iVar7 = 0;
        fprintf(_stderr,"error: %s",pcVar9);
      }
    }
  }
  return iVar7;
}

Assistant:

static int
fctkern__cl_parse(fctkern_t *nk)
{
    int status =0;
    size_t num_params =0;
    size_t param_i =0;
    if ( nk == NULL )
    {
        return 0;
    }
    if ( nk->cl_user_opts != NULL )
    {
        if ( !fct_clp__add_options(&(nk->cl_parser), nk->cl_user_opts) )
        {
            status =0;
            goto finally;
        }
    }
    /* You want to add the "house options" after the user defined ones. The
    options are stored as a list so it means that any option listed after
    the above ones won't get parsed. */
    if ( !fct_clp__add_options(&(nk->cl_parser), FCT_CLP_OPTIONS) )
    {
        status =0;
        goto finally;
    }
    fct_clp__parse(&(nk->cl_parser), nk->cl_argc, nk->cl_argv);
    if ( fct_clp__is_error(&(nk->cl_parser)) )
    {
        char *err = fct_clp__get_error(&(nk->cl_parser));
        fprintf(stderr, "error: %s", err);
        status =0;
        goto finally;
    }
    num_params = fct_clp__param_cnt(&(nk->cl_parser));
    for ( param_i =0; param_i != num_params; ++param_i )
    {
        char const *param = fct_clp__param_at(&(nk->cl_parser), param_i);
        fctkern__add_prefix_filter(nk, param);
    }
    if ( fctkern__cl_is(nk, FCT_OPT_VERSION) )
    {
        (void)printf("Built using FCTX version %s.\n", FCT_VERSION_STR);
        status = -1;
        goto finally;
    }
    if ( fctkern__cl_is(nk, FCT_OPT_HELP) )
    {
        fctkern__write_help(nk, stdout);
        status = -1;
        goto finally;
    }
    if ( !fctkern__cl_parse_config_logger(nk) )
    {
        status = -1;
        goto finally;
    }
    status =1;
    nk->cl_is_parsed =1;
finally:
    return status;
}